

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void display_feeling(_Bool obj_only)

{
  ulong uVar1;
  vault *pvVar2;
  undefined8 in_RSI;
  vault *level;
  char *join;
  uint16_t mon_feeling;
  uint16_t obj_feeling;
  _Bool obj_only_local;
  
  join._4_2_ = cave->feeling / 10;
  uVar1 = (ulong)cave->feeling % 10;
  join._2_2_ = (ushort)cave->feeling + join._4_2_ * -10;
  if (((player->opts).opt[0x24] & 1U) != 0) {
    if (player->depth == 0) {
      msg("Looks like a typical town.",in_RSI,uVar1);
    }
    else if (player->themed_level == '\0') {
      if (obj_only) {
        disturb(player);
        msg("You feel that %s",obj_feeling_text[join._4_2_]);
      }
      else if (cave->feeling_squares < z_info->feeling_need) {
        msg("%s.",mon_feeling_text[join._2_2_],uVar1);
      }
      else {
        if (10 < join._4_2_) {
          join._4_2_ = 10;
        }
        if (9 < join._2_2_) {
          join._2_2_ = 9;
        }
        if (((join._2_2_ < 6) && (6 < join._4_2_)) || ((5 < join._2_2_ && (join._4_2_ < 7)))) {
          level = (vault *)anon_var_dwarf_11c0c;
        }
        else {
          level = (vault *)anon_var_dwarf_11c17;
        }
        msg("%s%s %s",mon_feeling_text[join._2_2_],level,obj_feeling_text[join._4_2_]);
      }
    }
    else {
      pvVar2 = themed_level((uint)player->themed_level);
      msg("%s",pvVar2->typ);
    }
  }
  return;
}

Assistant:

void display_feeling(bool obj_only)
{
	uint16_t obj_feeling = cave->feeling / 10;
	uint16_t mon_feeling = cave->feeling - (10 * obj_feeling);
	const char *join;

	/* Don't show feelings for cold-hearted characters */
	if (!OPT(player, birth_feelings)) return;

	/* No useful feeling in town */
	if (!player->depth) {
		msg("Looks like a typical town.");
		return;
	}

	/* Special message for themed levels */
	if (player->themed_level) {
		struct vault *level = themed_level(player->themed_level);
		msg("%s", level->typ);
		return;
	}

	/* Display only the object feeling when it's first discovered. */
	if (obj_only) {
		disturb(player);
		msg("You feel that %s", obj_feeling_text[obj_feeling]);
		return;
	}

	/* Players automatically get a monster feeling. */
	if (cave->feeling_squares < z_info->feeling_need) {
		msg("%s.", mon_feeling_text[mon_feeling]);
		return;
	}

	/* Verify the feelings */
	if (obj_feeling >= N_ELEMENTS(obj_feeling_text))
		obj_feeling = N_ELEMENTS(obj_feeling_text) - 1;

	if (mon_feeling >= N_ELEMENTS(mon_feeling_text))
		mon_feeling = N_ELEMENTS(mon_feeling_text) - 1;

	/* Decide the conjunction */
	if ((mon_feeling <= 5 && obj_feeling > 6) ||
			(mon_feeling > 5 && obj_feeling <= 6))
		join = ", yet";
	else
		join = ", and";

	/* Display the feeling */
	msg("%s%s %s", mon_feeling_text[mon_feeling], join,
		obj_feeling_text[obj_feeling]);
}